

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[110]>(String *__return_storage_ptr__,kj *this,char (*params) [110])

{
  size_t size;
  String *result;
  char *__dest;
  
  size = strlen((char *)this);
  heapString(__return_storage_ptr__,size);
  if (size != 0) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,this,size);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}